

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_4dPoint * __thiscall ON_4dPoint::operator/=(ON_4dPoint *this,double d)

{
  double dVar1;
  double one_over_d;
  double d_local;
  ON_4dPoint *this_local;
  
  dVar1 = 1.0 / d;
  this->x = dVar1 * this->x;
  this->y = dVar1 * this->y;
  this->z = dVar1 * this->z;
  this->w = dVar1 * this->w;
  return this;
}

Assistant:

ON_4dPoint& ON_4dPoint::operator/=(double d)
{
  const double one_over_d = 1.0/d;
  x *= one_over_d;
  y *= one_over_d;
  z *= one_over_d;
  w *= one_over_d;
  return *this;
}